

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkobj.c
# Opt level: O2

void start_corpse_timeout(obj *body)

{
  int iVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  int iVar4;
  short func_index;
  long lVar5;
  long lVar6;
  long lVar7;
  
  if ((body->corpsenm == 0xa3) || (body->corpsenm == 0x154)) {
    return;
  }
  lVar7 = 0x19;
  if (in_mklev == '\0') {
    lVar7 = 10;
  }
  uVar3 = moves - body->age;
  lVar6 = 0xfa - (ulong)uVar3;
  if (0xfa < uVar3) {
    lVar6 = lVar7;
  }
  uVar3 = mt_random();
  iVar4 = rne(4);
  lVar5 = (long)iVar4 * (ulong)(uVar3 % 1000 + 1000);
  uVar3 = mt_random();
  if ((uVar3 & 1) == 0) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = lVar7 * 1000;
    iVar4 = SUB164(auVar2 / SEXT816(lVar5),0);
  }
  else {
    iVar4 = (int)((lVar5 * lVar7) / 1000);
  }
  iVar1 = body->corpsenm;
  lVar5 = (long)iVar1;
  if (iVar1 - 0x144U < 3) {
    func_index = 2;
    for (lVar6 = 0xc; lVar6 != 500; lVar6 = lVar6 + 1) {
      uVar3 = mt_random();
      if (uVar3 % 3 == 0) goto LAB_001d6a27;
    }
    lVar6 = 500;
    goto LAB_001d6a27;
  }
  lVar6 = lVar6 + (iVar4 - (int)lVar7);
  func_index = 1;
  if ((body->field_0x4b & 0xc) != 0) goto LAB_001d6a27;
  if ((iVar1 - 0xfdU < 2) || (mons[lVar5].mlet != '4')) {
LAB_001d6a9b:
    if (mons[lVar5].mlet != '.') goto LAB_001d6a27;
  }
  else if ((urole.malenum == 0x161) && (uVar3 = mt_random(), (uVar3 & 1) == 0)) {
    lVar5 = (long)body->corpsenm;
    goto LAB_001d6a9b;
  }
  if (((body->oxlth != 0) && ((*(uint *)&body->field_0x4a & 0x600000) == 0x200000)) &&
     ((body[1].age & 0x100) == 0)) {
    for (lVar7 = 2; lVar7 != 0x33; lVar7 = lVar7 + 1) {
      uVar3 = mt_random();
      if (uVar3 % 0x25 == 0) {
        func_index = 2;
        lVar6 = lVar7;
        break;
      }
    }
  }
LAB_001d6a27:
  if ((*(uint *)&body->field_0x4a & 0xc00) != 0) {
    *(uint *)&body->field_0x4a = *(uint *)&body->field_0x4a & 0xfffff3ff;
  }
  start_timer(body->olev,lVar6,2,func_index,body);
  return;
}

Assistant:

void start_corpse_timeout(struct obj *body)
{
	long when; 		/* rot away when this old */
	long corpse_age;	/* age of corpse          */
	int rot_adjust;
	short action;

#define TAINT_AGE (50L)		/* age when corpses go bad */
#define REVIVE_CHANCE 37	/* 1/37 chance for 50 turns ~ 75% chance */
#define ROT_AGE (250L)		/* age when corpses rot away */

	/* lizards and lichen don't rot or revive */
	if (body->corpsenm == PM_LIZARD || body->corpsenm == PM_LICHEN) return;

	action = ROT_CORPSE;		/* default action: rot away */
	rot_adjust = in_mklev ? 25 : 10;	/* give some variation */
	corpse_age = moves - body->age;
	if (corpse_age > ROT_AGE)
		when = rot_adjust;
	else
		when = ROT_AGE - corpse_age;
	when += (long)(rnz(rot_adjust) - rot_adjust);

	if (is_rider(&mons[body->corpsenm])) {
		/*
		 * Riders always revive.  They have a 1/3 chance per turn
		 * of reviving after 12 turns.  Always revive by 500.
		 */
		action = REVIVE_MON;
		for (when = 12L; when < 500L; when++)
		    if (!rn2(3)) break;

	} else if (!body->norevive &&
		   ((is_zombie(&mons[body->corpsenm]) &&
		     /* Priests have a chance to put down zombies for good. */
		     !(Role_if(PM_PRIEST) && !rn2(2))) ||
		    mons[body->corpsenm].mlet == S_TROLL)) {
		long age;
		struct monst *mtmp = get_mtraits(body, FALSE);
		if (mtmp && !mtmp->mcan) {
		    for (age = 2; age <= TAINT_AGE; age++) {
			if (!rn2(REVIVE_CHANCE)) {	/* monster revives */
			    action = REVIVE_MON;
			    when = age;
			    break;
			}
		    }
		}
	}

	if (body->norevive) body->norevive = 0;
	start_timer(body->olev, when, TIMER_OBJECT, action, body);
}